

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

Matrix3d * Util::Angle2RotM(Vector3d *angles,vector<int,_std::allocator<int>_> *order)

{
  int iVar1;
  reference pvVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  ostream *this;
  vector<int,_std::allocator<int>_> *in_RDX;
  Matrix3d *in_RDI;
  double dVar5;
  Matrix3d R_iter;
  int ii;
  Matrix3d R;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffe58;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *in_stack_fffffffffffffe60;
  double in_stack_fffffffffffffe80;
  Scalar in_stack_fffffffffffffe88;
  int local_68;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
            ((Index)in_stack_fffffffffffffe88,(Index)in_stack_fffffffffffffe80);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
              ((Index)in_stack_fffffffffffffe88,(Index)in_stack_fffffffffffffe80);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58)
    ;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_68);
    iVar1 = *pvVar2;
    if (iVar1 == 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = cos(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d547);
      *pSVar4 = dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = sin(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d58c);
      *pSVar4 = dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = sin(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d5e8);
      *pSVar4 = -dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = cos(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d62b);
      *pSVar4 = dVar5;
    }
    else if (iVar1 == 2) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe80 = cos(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d672);
      *pSVar4 = in_stack_fffffffffffffe80;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = sin(*pSVar3);
      in_stack_fffffffffffffe88 = -dVar5;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d6cd);
      *pSVar4 = in_stack_fffffffffffffe88;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = sin(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d711);
      *pSVar4 = dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = cos(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d754);
      *pSVar4 = dVar5;
    }
    else if (iVar1 == 3) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe60 =
           (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)cos(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d79b);
      *pSVar4 = (Scalar)in_stack_fffffffffffffe60;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = sin(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d7df);
      *pSVar4 = dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = sin(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d83a);
      *pSVar4 = -dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      dVar5 = cos(*pSVar3);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x12d87d);
      *pSVar4 = dVar5;
    }
    else {
      this = std::operator<<((ostream *)&std::cout,"Error: Bad Angle Selection!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe60,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe58);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffe60,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)in_stack_fffffffffffffe58);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffe60,
             (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffe58);
  OrthoNormMat((Matrix3d *)angles);
  return in_RDI;
}

Assistant:

Eigen::Matrix3d Angle2RotM(Eigen::Vector3d angles, std::vector<int> order){

		//initialize matrix
		Eigen::Matrix3d R = Eigen::Matrix3d::Identity(3,3);

		for (int ii = 0; ii < 3; ++ii){
			
			//iteration matrix
			Eigen::Matrix3d R_iter = Eigen::Matrix3d::Identity(3,3);

			//switch case
			switch(order[ii]) {
				case 1 : {
					R_iter(1,1) = cos(angles[ii]);
					R_iter(1,2) = sin(angles[ii]);
					R_iter(2,1) = -sin(angles[ii]);
					R_iter(2,2) = cos(angles[ii]);
					break;
				} case 2 : {
					R_iter(0,0) = cos(angles[ii]);
					R_iter(0,2) = -sin(angles[ii]);
					R_iter(2,0) = sin(angles[ii]);
					R_iter(2,2) = cos(angles[ii]);
					break;
				} case 3 : {
					R_iter(0,0) = cos(angles[ii]);
					R_iter(0,1) = sin(angles[ii]);
					R_iter(1,0) = -sin(angles[ii]);
					R_iter(1,1) = cos(angles[ii]);
					break;
				} default : {
					std::cout << "Error: Bad Angle Selection!" << std::endl;
				}
			} // switch

			//multiply
			R = R_iter*R;

		} // for

		//output
		return OrthoNormMat(R); // not super sure if this should actually be R.transpose()

	}